

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O1

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::addSlot
          (TableSlotManager *this,Name func,Slot slot)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  IString local_68;
  _Base_ptr local_58;
  _Base_ptr p_Stack_50;
  size_t local_48;
  _Base_ptr p_Stack_40;
  _Base_ptr local_38;
  
  local_68.str._M_str = func.super_IString.str._M_str;
  local_68.str._M_len = func.super_IString.str._M_len;
  local_38 = (_Base_ptr)slot._32_8_;
  local_48 = slot.global.super_IString.str._M_len;
  p_Stack_40 = (_Base_ptr)slot.global.super_IString.str._M_str;
  local_58 = (_Base_ptr)slot.tableName.super_IString.str._M_len;
  p_Stack_50 = (_Base_ptr)slot.tableName.super_IString.str._M_str;
  p_Var1 = &(this->funcIndices)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 == (_Base_ptr)0x0) {
    bVar3 = true;
    p_Var6 = &p_Var1->_M_header;
  }
  else {
    do {
      p_Var6 = p_Var5;
      bVar3 = IString::operator<(&local_68,(IString *)(p_Var6 + 1));
      p_Var5 = (&p_Var6->_M_left)[!bVar3];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  p_Var4 = p_Var6;
  if (bVar3 != false) {
    if (p_Var6 == (this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_00757567;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var6);
  }
  bVar3 = IString::operator<((IString *)(p_Var4 + 1),&local_68);
  if (!bVar3) {
    p_Var5 = p_Var4;
    p_Var6 = (_Rb_tree_node_base *)0x0;
  }
LAB_00757567:
  if (p_Var6 != (_Rb_tree_node_base *)0x0) {
    bVar3 = true;
    if ((p_Var5 == (_Base_ptr)0x0) && (p_Var1 != (_Rb_tree_header *)p_Var6)) {
      bVar3 = IString::operator<(&local_68,(IString *)(p_Var6 + 1));
    }
    p_Var4 = (_Rb_tree_node_base *)operator_new(0x58);
    *(size_t *)(p_Var4 + 1) = local_68.str._M_len;
    p_Var4[1]._M_parent = (_Base_ptr)local_68.str._M_str;
    p_Var4[1]._M_left = local_58;
    p_Var4[1]._M_right = p_Stack_50;
    *(size_t *)(p_Var4 + 2) = local_48;
    p_Var4[2]._M_parent = p_Stack_40;
    p_Var4[2]._M_left = local_38;
    std::_Rb_tree_insert_and_rebalance(bVar3,p_Var4,p_Var6,&p_Var1->_M_header);
    psVar2 = &(this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
  }
  return;
}

Assistant:

void TableSlotManager::addSlot(Name func, Slot slot) {
  // Ignore functions that already have slots.
  funcIndices.insert({func, slot});
}